

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_state.cc
# Opt level: O2

void pgraph_gen_state_celsius(int cnum,mt19937 *rnd,pgraph_state *state)

{
  undefined8 *puVar1;
  uint uVar2;
  Register *pRVar3;
  bool bVar4;
  uint32_t uVar5;
  result_type rVar6;
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> *reg;
  pointer puVar7;
  int j;
  long lVar8;
  int i;
  long lVar9;
  uint32_t (*pauVar10) [4];
  uint32_t (*pauVar11) [3];
  vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
  local_48;
  
  hwtest::pgraph::pgraph_celsius_regs(&local_48,&state->chipset);
  for (puVar7 = local_48.
                super__Vector_base<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar7 != local_48.
                super__Vector_base<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; puVar7 = puVar7 + 1) {
    pRVar3 = (puVar7->_M_t).
             super___uniq_ptr_impl<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
             ._M_t.
             super__Tuple_impl<0UL,_hwtest::pgraph::Register_*,_std::default_delete<hwtest::pgraph::Register>_>
             .super__Head_base<0UL,_hwtest::pgraph::Register_*,_false>._M_head_impl;
    (*pRVar3->_vptr_Register[8])(pRVar3,state,cnum,rnd);
  }
  std::
  vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
  ::~vector(&local_48);
  rVar6 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(rnd);
  state->celsius_pipe_begin_end = (uint)rVar6 & 0xf;
  rVar6 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(rnd);
  state->celsius_pipe_edge_flag = (uint)rVar6 & 1;
  state->celsius_pipe_unk48 = 0;
  rVar6 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(rnd);
  state->celsius_pipe_vtx_state = (uint)rVar6 & 0x70001f3f;
  for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    state->celsius_pipe_vtxbuf_offset[lVar9] = (uint)rVar6 & 0xffffffc;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    uVar5 = pgraph_celsius_fixup_vtxbuf_format(state,(int)lVar9,(uint32_t)rVar6);
    state->celsius_pipe_vtxbuf_format[lVar9] = uVar5;
    state->celsius_pipe_vtxbuf_format[lVar9] =
         state->celsius_pipe_vtxbuf_format[0] & 0x1000000 | uVar5 & 0xfeffffff;
  }
  if ((state->chipset).chipset == 0x10) {
    state->celsius_pipe_vtxbuf_format[2] =
         (state->celsius_pipe_vtxbuf_format[2] & 0xfffffffb) +
         (uint)((state->celsius_pipe_vtxbuf_format[1] & 7) != 0) * 4;
  }
  for (lVar9 = 0; lVar9 != 0x1c; lVar9 = lVar9 + 1) {
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    state->celsius_pipe_vtx[lVar9] = (uint32_t)rVar6;
  }
  for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    state->celsius_pipe_junk[lVar9] = (uint32_t)rVar6;
  }
  pauVar10 = state->celsius_pipe_xfrm;
  for (lVar9 = 0; lVar9 != 0x3c; lVar9 = lVar9 + 1) {
    for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
      rVar6 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(rnd);
      (*pauVar10)[lVar8] = (uint32_t)rVar6;
    }
    pauVar10 = pauVar10 + 1;
  }
  pauVar11 = state->celsius_pipe_light_v;
  for (lVar9 = 0; lVar9 != 0x30; lVar9 = lVar9 + 1) {
    for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
      rVar6 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(rnd);
      (*pauVar11)[lVar8] = (uint)rVar6 & 0xfffffc00;
    }
    pauVar11 = pauVar11 + 1;
  }
  for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    uVar5 = canonical_light_sx_float((uint32_t)rVar6);
    state->celsius_pipe_light_sa[lVar9] = uVar5;
  }
  for (lVar9 = 0; lVar9 != 0x13; lVar9 = lVar9 + 1) {
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    uVar5 = canonical_light_sx_float((uint32_t)rVar6);
    state->celsius_pipe_light_sb[lVar9] = uVar5;
  }
  for (lVar9 = 0; lVar9 != 0xc; lVar9 = lVar9 + 1) {
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    uVar5 = canonical_light_sx_float((uint32_t)rVar6);
    state->celsius_pipe_light_sc[lVar9] = uVar5;
  }
  for (lVar9 = 0; lVar9 != 0xc; lVar9 = lVar9 + 1) {
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    uVar5 = canonical_light_sx_float((uint32_t)rVar6);
    state->celsius_pipe_light_sd[lVar9] = uVar5;
  }
  state->celsius_pipe_light_sa[0] = 0x3f800000;
  state->celsius_pipe_light_sb[0] = 0;
  state->celsius_pipe_light_sc[0] = 0x3f800000;
  state->celsius_pipe_light_sd[0] = 0;
  if ((state->chipset).chipset == 0x10) {
    *(uint32_t *)((long)(state->celsius_pipe_light_v + 0x2f) + 0) = 0;
    *(uint32_t *)((long)(state->celsius_pipe_light_v + 0x2f) + 4) = 0;
    state->celsius_pipe_light_v[0x2f][2] = 0;
    *(uint32_t *)((long)(state->celsius_pipe_xfrm + 0x3b) + 0) = 0;
    *(uint32_t *)((long)(state->celsius_pipe_xfrm + 0x3b) + 4) = 0;
    *(uint32_t *)((long)(state->celsius_pipe_xfrm + 0x3b) + 8) = 0;
    *(uint32_t *)((long)(state->celsius_pipe_xfrm + 0x3b) + 0xc) = 0;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    bVar4 = (bool)((byte)rVar6 & 1);
  }
  else {
    bVar4 = false;
  }
  state->celsius_pipe_broke_ovtx = bVar4;
  rVar6 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(rnd);
  state->celsius_pipe_ovtx_pos = (uint)rVar6 & 0xf;
  state->celsius_pipe_prev_ovtx_pos = 0xf;
  for (lVar9 = 0; lVar9 != 0xc0; lVar9 = lVar9 + 0x40) {
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(uint *)((long)state->celsius_pipe_xvtx[0] + lVar9) = (uint)rVar6 & 0xbfffffff;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(uint *)((long)state->celsius_pipe_xvtx[0] + lVar9 + 4) = (uint)rVar6 & 0xbfffffff;
    *(undefined4 *)((long)state->celsius_pipe_xvtx[0] + lVar9 + 8) = 0;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(uint *)((long)state->celsius_pipe_xvtx[0] + lVar9 + 0xc) = (uint)rVar6 & 0xbfffffff;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(uint *)((long)state->celsius_pipe_xvtx[0] + lVar9 + 0x10) = (uint)rVar6 & 0xbfffffff;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(uint *)((long)state->celsius_pipe_xvtx[0] + lVar9 + 0x14) = (uint)rVar6 & 0xbfffffff;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(uint *)((long)state->celsius_pipe_xvtx[0] + lVar9 + 0x18) = (uint)rVar6 & 0x1ff000;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(uint *)((long)state->celsius_pipe_xvtx[0] + lVar9 + 0x1c) = (uint)rVar6 & 0xbfffffff;
    *(undefined4 *)((long)state->celsius_pipe_xvtx[0] + lVar9 + 0x20) = 0;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    uVar5 = canonical_light_sx_float((uint32_t)rVar6);
    *(uint32_t *)((long)state->celsius_pipe_xvtx[0] + lVar9 + 0x24) = uVar5 & 0xfffffbff;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(int *)((long)state->celsius_pipe_xvtx[0] + lVar9 + 0x28) = (int)rVar6;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(uint *)((long)state->celsius_pipe_xvtx[0] + lVar9 + 0x2c) = (uint)rVar6 & 0xffffff01;
    puVar1 = (undefined8 *)((long)state->celsius_pipe_xvtx[0] + lVar9 + 0x30);
    *puVar1 = 0;
    puVar1[1] = 0x3f80000000000000;
    uVar2 = state->bundle_config_b;
    if ((uVar2 >> 9 & 1) == 0) {
      *(uint32_t *)((long)state->celsius_pipe_xvtx[0] + lVar9 + 0x18) =
           state->bundle_point_size << 0xc;
    }
    if ((uVar2 & 0x20) == 0) {
      *(uint *)((long)state->celsius_pipe_xvtx[0] + lVar9 + 0x2c) = (uint)rVar6 & 1;
    }
  }
  for (lVar9 = 0; lVar9 != 0x400; lVar9 = lVar9 + 0x40) {
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(uint *)((long)state->celsius_pipe_ovtx[0] + lVar9) = (uint)rVar6 & 0xbfffffff;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(uint *)((long)state->celsius_pipe_ovtx[0] + lVar9 + 4) = (uint)rVar6 & 0xbfffffff;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(uint *)((long)state->celsius_pipe_ovtx[0] + lVar9 + 8) = (uint)rVar6 & 0x1ff000;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(uint *)((long)state->celsius_pipe_ovtx[0] + lVar9 + 0xc) = (uint)rVar6 & 0xbfffffff;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(uint *)((long)state->celsius_pipe_ovtx[0] + lVar9 + 0x10) = (uint)rVar6 & 0xbfffffff;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(uint *)((long)state->celsius_pipe_ovtx[0] + lVar9 + 0x14) = (uint)rVar6 & 0xbfffffff;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(uint *)((long)state->celsius_pipe_ovtx[0] + lVar9 + 0x18) = (uint)rVar6 & 0xbfffffff;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(uint *)((long)state->celsius_pipe_ovtx[0] + lVar9 + 0x1c) = (uint)rVar6 & 0xbfffffff;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(int *)((long)state->celsius_pipe_ovtx[0] + lVar9 + 0x20) = (int)rVar6;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    uVar5 = canonical_light_sx_float((uint)rVar6 & 0xfffff800 | (uint)rVar6 >> 1 & 0x400);
    *(uint32_t *)((long)state->celsius_pipe_ovtx[0] + lVar9 + 0x24) = uVar5;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(int *)((long)state->celsius_pipe_ovtx[0] + lVar9 + 0x28) = (int)rVar6;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(uint *)((long)state->celsius_pipe_ovtx[0] + lVar9 + 0x2c) = (uint)rVar6 & 0xffffff01;
    puVar1 = (undefined8 *)((long)state->celsius_pipe_ovtx[0] + lVar9 + 0x30);
    *puVar1 = 0;
    puVar1[1] = 0x3f80000000000000;
    *(uint *)((long)state->celsius_pipe_ovtx[0] + lVar9 + 8) =
         (uint)rVar6 << 0x1f | *(uint *)((long)state->celsius_pipe_ovtx[0] + lVar9 + 8) & 0x7fffffff
    ;
  }
  return;
}

Assistant:

void pgraph_gen_state_celsius(int cnum, std::mt19937 &rnd, struct pgraph_state *state) {
	for (auto &reg : pgraph_celsius_regs(state->chipset)) {
		reg->gen(state, cnum, rnd);
	}
	state->celsius_pipe_begin_end = rnd() & 0xf;
	state->celsius_pipe_edge_flag = rnd() & 0x1;
	state->celsius_pipe_unk48 = 0;
	state->celsius_pipe_vtx_state = rnd() & 0x70001f3f;
	for (int i = 0; i < 8; i++) {
		state->celsius_pipe_vtxbuf_offset[i] = rnd() & 0x0ffffffc;
		state->celsius_pipe_vtxbuf_format[i] = pgraph_celsius_fixup_vtxbuf_format(state, i, rnd());
		insrt(state->celsius_pipe_vtxbuf_format[i], 24, 1, extr(state->celsius_pipe_vtxbuf_format[0], 24, 1));
	}
	if (state->chipset.chipset == 0x10) {
		if (extr(state->celsius_pipe_vtxbuf_format[1], 0, 3) == 0)
			insrt(state->celsius_pipe_vtxbuf_format[2], 2, 1, 0);
		else
			insrt(state->celsius_pipe_vtxbuf_format[2], 2, 1, 1);
	}
	for (int i = 0; i < 0x1c; i++)
		state->celsius_pipe_vtx[i] = rnd();
	for (int i = 0; i < 4; i++)
		state->celsius_pipe_junk[i] = rnd();
	for (int i = 0; i < 0x3c; i++)
		for (int j = 0; j < 4; j++) {
			state->celsius_pipe_xfrm[i][j] = rnd();
		}
	for (int i = 0; i < 0x30; i++)
		for (int j = 0; j < 3; j++) {
			state->celsius_pipe_light_v[i][j] = rnd() & 0xfffffc00;
		}
	for (int i = 0; i < 3; i++)
		state->celsius_pipe_light_sa[i] = canonical_light_sx_float(rnd());
	for (int i = 0; i < 19; i++)
		state->celsius_pipe_light_sb[i] = canonical_light_sx_float(rnd());
	for (int i = 0; i < 12; i++)
		state->celsius_pipe_light_sc[i] = canonical_light_sx_float(rnd());
	for (int i = 0; i < 12; i++)
		state->celsius_pipe_light_sd[i] = canonical_light_sx_float(rnd());
	state->celsius_pipe_light_sa[0] = 0x3f800000;
	state->celsius_pipe_light_sb[0] = 0;
	state->celsius_pipe_light_sc[0] = 0x3f800000;
	state->celsius_pipe_light_sd[0] = 0;
	if (state->chipset.chipset == 0x10) {
		state->celsius_pipe_xfrm[59][0] = 0;
		state->celsius_pipe_xfrm[59][1] = 0;
		state->celsius_pipe_xfrm[59][2] = 0;
		state->celsius_pipe_xfrm[59][3] = 0;
		state->celsius_pipe_light_v[47][0] = 0;
		state->celsius_pipe_light_v[47][1] = 0;
		state->celsius_pipe_light_v[47][2] = 0;
		state->celsius_pipe_broke_ovtx = rnd() & 1;
	} else {
		state->celsius_pipe_broke_ovtx = false;
	}
	state->celsius_pipe_ovtx_pos = rnd() & 0xf;
	state->celsius_pipe_prev_ovtx_pos = 0xf;
	for (int i = 0; i < 3; i++) {
		// XXX clean this.
		state->celsius_pipe_xvtx[i][0] = rnd() & 0xbfffffff;
		state->celsius_pipe_xvtx[i][1] = rnd() & 0xbfffffff;
		state->celsius_pipe_xvtx[i][2] = 0;
		state->celsius_pipe_xvtx[i][3] = rnd() & 0xbfffffff;
		state->celsius_pipe_xvtx[i][4] = rnd() & 0xbfffffff;
		state->celsius_pipe_xvtx[i][5] = rnd() & 0xbfffffff;
		state->celsius_pipe_xvtx[i][6] = rnd() & 0x001ff000;
		state->celsius_pipe_xvtx[i][7] = rnd() & 0xbfffffff;
		state->celsius_pipe_xvtx[i][8] = 0;
		state->celsius_pipe_xvtx[i][9] = canonical_light_sx_float(rnd()) & ~0x400;
		state->celsius_pipe_xvtx[i][10] = rnd();
		state->celsius_pipe_xvtx[i][11] = rnd() & 0xffffff01;
		state->celsius_pipe_xvtx[i][12] = 0;
		state->celsius_pipe_xvtx[i][13] = 0;
		state->celsius_pipe_xvtx[i][14] = 0;
		state->celsius_pipe_xvtx[i][15] = 0x3f800000;
		/* If point params are disabled, point size comes from the global state.
		 * Since we have to load global state before pipe state, there's apparently
		 * no way to cheat here...  */
		if (!extr(state->bundle_config_b, 9, 1))
			state->celsius_pipe_xvtx[i][6] = state->bundle_point_size << 12;
		/* Same for specular enable.  */
		if (!extr(state->bundle_config_b, 5, 1))
			state->celsius_pipe_xvtx[i][11] &= 1;
	}
	for (int i = 0; i < 0x10; i++) {
		// XXX clean this.
		state->celsius_pipe_ovtx[i][0] = rnd() & 0xbfffffff;
		state->celsius_pipe_ovtx[i][1] = rnd() & 0xbfffffff;
		state->celsius_pipe_ovtx[i][2] = rnd() & 0x001ff000;
		state->celsius_pipe_ovtx[i][3] = rnd() & 0xbfffffff;
		state->celsius_pipe_ovtx[i][4] = rnd() & 0xbfffffff;
		state->celsius_pipe_ovtx[i][5] = rnd() & 0xbfffffff;
		state->celsius_pipe_ovtx[i][6] = rnd() & 0xbfffffff;
		state->celsius_pipe_ovtx[i][7] = rnd() & 0xbfffffff;
		state->celsius_pipe_ovtx[i][8] = rnd();
		state->celsius_pipe_ovtx[i][9] = canonical_light_sx_float(canonical_ovtx_fog(rnd()));
		state->celsius_pipe_ovtx[i][10] = rnd();
		state->celsius_pipe_ovtx[i][11] = rnd() & 0xffffff01;
		state->celsius_pipe_ovtx[i][12] = 0;
		state->celsius_pipe_ovtx[i][13] = 0;
		state->celsius_pipe_ovtx[i][14] = 0;
		state->celsius_pipe_ovtx[i][15] = 0x3f800000;
		insrt(state->celsius_pipe_ovtx[i][2], 31, 1, extr(state->celsius_pipe_ovtx[i][11], 0, 1));
	}
}